

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_bdd.c
# Opt level: O0

size_t sylvan_serialize_get(BDD bdd)

{
  int iVar1;
  sylvan_ser *psVar2;
  sylvan_ser *ss;
  sylvan_ser s;
  BDD bdd_local;
  
  s.assigned = bdd;
  iVar1 = sylvan_isnode(bdd);
  if (iVar1 == 0) {
    bdd_local = s.assigned;
  }
  else {
    ss = (sylvan_ser *)MTBDD_STRIPMARK(s.assigned);
    psVar2 = sylvan_ser_search(sylvan_ser_set,(sylvan_ser *)&ss);
    if (psVar2 == (sylvan_ser *)0x0) {
      __assert_fail("ss != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_bdd.c"
                    ,0x8ad,"size_t sylvan_serialize_get(BDD)");
    }
    bdd_local = MTBDD_TRANSFERMARK(s.assigned,psVar2->assigned);
  }
  return bdd_local;
}

Assistant:

size_t
sylvan_serialize_get(BDD bdd)
{
    if (!sylvan_isnode(bdd)) return bdd;
    struct sylvan_ser s, *ss;
    s.bdd = BDD_STRIPMARK(bdd);
    ss = sylvan_ser_search(sylvan_ser_set, &s);
    assert(ss != NULL);
    return BDD_TRANSFERMARK(bdd, ss->assigned);
}